

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walUnlockShared(Wal *pWal,int lockIdx)

{
  int lockIdx_local;
  Wal *pWal_local;
  
  if (pWal->exclusiveMode == '\0') {
    sqlite3OsShmLock(pWal->pDbFd,lockIdx,1,5);
  }
  return;
}

Assistant:

static void walUnlockShared(Wal *pWal, int lockIdx){
  if( pWal->exclusiveMode ) return;
  (void)sqlite3OsShmLock(pWal->pDbFd, lockIdx, 1,
                         SQLITE_SHM_UNLOCK | SQLITE_SHM_SHARED);
#ifdef SQLITE_USE_SEH
  pWal->lockMask &= ~(1 << lockIdx);
#endif
  WALTRACE(("WAL%p: release SHARED-%s\n", pWal, walLockName(lockIdx)));
}